

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

ssize_t __thiscall
fmt::BasicWriter<char>::write(BasicWriter<char> *this,int __fd,void *__buf,size_t __n)

{
  ssize_t extraout_RAX;
  ssize_t extraout_RAX_00;
  ssize_t sVar1;
  undefined4 in_register_00000034;
  BasicCStringRef<char> format_str;
  BasicFormatter<char,_fmt::ArgFormatter<char>_> local_40;
  
  format_str.data_._4_4_ = in_register_00000034;
  format_str.data_._0_4_ = __fd;
  local_40.super_FormatterBase.next_arg_index_ = 0;
  local_40.map_.map_.
  super__Vector_base<std::pair<fmt::BasicStringRef<char>,_fmt::internal::Arg>,_std::allocator<std::pair<fmt::BasicStringRef<char>,_fmt::internal::Arg>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_40.map_.map_.
  super__Vector_base<std::pair<fmt::BasicStringRef<char>,_fmt::internal::Arg>,_std::allocator<std::pair<fmt::BasicStringRef<char>,_fmt::internal::Arg>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_40.map_.map_.
  super__Vector_base<std::pair<fmt::BasicStringRef<char>,_fmt::internal::Arg>,_std::allocator<std::pair<fmt::BasicStringRef<char>,_fmt::internal::Arg>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_40.super_FormatterBase.args_.types_ = (uint64_t)__buf;
  local_40.super_FormatterBase.args_.field_1 = (anon_union_8_2_de49483c_for_ArgList_1)__n;
  local_40.writer_ = this;
  BasicFormatter<char,_fmt::ArgFormatter<char>_>::format(&local_40,format_str);
  sVar1 = extraout_RAX;
  if (local_40.map_.map_.
      super__Vector_base<std::pair<fmt::BasicStringRef<char>,_fmt::internal::Arg>,_std::allocator<std::pair<fmt::BasicStringRef<char>,_fmt::internal::Arg>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_40.map_.map_.
                    super__Vector_base<std::pair<fmt::BasicStringRef<char>,_fmt::internal::Arg>,_std::allocator<std::pair<fmt::BasicStringRef<char>,_fmt::internal::Arg>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_40.map_.map_.
                          super__Vector_base<std::pair<fmt::BasicStringRef<char>,_fmt::internal::Arg>,_std::allocator<std::pair<fmt::BasicStringRef<char>,_fmt::internal::Arg>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_40.map_.map_.
                          super__Vector_base<std::pair<fmt::BasicStringRef<char>,_fmt::internal::Arg>,_std::allocator<std::pair<fmt::BasicStringRef<char>,_fmt::internal::Arg>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
    sVar1 = extraout_RAX_00;
  }
  return sVar1;
}

Assistant:

void write(BasicCStringRef<Char> format, ArgList args)
    {
        BasicFormatter<Char>(args, *this).format(format);
    }